

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_compressBegin_advanced_internal
                 (ZSTD_CCtx *cctx,void *dict,size_t dictSize,ZSTD_dictContentType_e dictContentType,
                 ZSTD_dictTableLoadMethod_e dtlm,ZSTD_CDict *cdict,ZSTD_CCtx_params *params,
                 unsigned_long_long pledgedSrcSize)

{
  undefined4 uVar1;
  ZSTD_compressionParameters cParams;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint uVar5;
  undefined8 in_stack_ffffffffffffff94;
  size_t err_code;
  ZSTD_CDict *cdict_local;
  ZSTD_dictTableLoadMethod_e dtlm_local;
  ZSTD_dictContentType_e dictContentType_local;
  size_t dictSize_local;
  void *dict_local;
  ZSTD_CCtx *cctx_local;
  
  uVar1 = (params->cParams).targetLength;
  uVar2 = (params->cParams).hashLog;
  uVar3 = (params->cParams).searchLog;
  uVar4 = (params->cParams).minMatch;
  cParams.hashLog = uVar4;
  cParams.chainLog = uVar3;
  cParams.windowLog = uVar2;
  cParams.searchLog = uVar1;
  cParams.minMatch = (params->cParams).strategy;
  cParams._20_8_ = in_stack_ffffffffffffff94;
  cctx_local = (ZSTD_CCtx *)ZSTD_checkCParams(cParams);
  uVar5 = ERR_isError((size_t)cctx_local);
  if (uVar5 == 0) {
    cctx_local = (ZSTD_CCtx *)
                 ZSTD_compressBegin_internal
                           (cctx,dict,dictSize,dictContentType,dtlm,cdict,params,pledgedSrcSize,
                            ZSTDb_not_buffered);
  }
  return (size_t)cctx_local;
}

Assistant:

size_t ZSTD_compressBegin_advanced_internal(ZSTD_CCtx* cctx,
                                    const void* dict, size_t dictSize,
                                    ZSTD_dictContentType_e dictContentType,
                                    ZSTD_dictTableLoadMethod_e dtlm,
                                    const ZSTD_CDict* cdict,
                                    const ZSTD_CCtx_params* params,
                                    unsigned long long pledgedSrcSize)
{
    DEBUGLOG(4, "ZSTD_compressBegin_advanced_internal: wlog=%u", params->cParams.windowLog);
    /* compression parameters verification and optimization */
    FORWARD_IF_ERROR( ZSTD_checkCParams(params->cParams) , "");
    return ZSTD_compressBegin_internal(cctx,
                                       dict, dictSize, dictContentType, dtlm,
                                       cdict,
                                       params, pledgedSrcSize,
                                       ZSTDb_not_buffered);
}